

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86.cpp
# Opt level: O0

void __thiscall ncnn::HardSigmoid_x86::forward_inplace(HardSigmoid_x86 *this)

{
  Option *in_stack_00000160;
  Mat *in_stack_00000168;
  HardSigmoid_x86 *in_stack_00000170;
  
  forward_inplace(in_stack_00000170,in_stack_00000168,in_stack_00000160);
  return;
}

Assistant:

int HardSigmoid_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}